

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_class_player.cpp
# Opt level: O0

void use_class_dota_player(void)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  undefined1 local_1d8 [8];
  Player p4;
  Player p3;
  Player *pp2;
  DotaPlayer p2;
  string local_150;
  undefined1 local_130 [8];
  Player p1;
  DotaPlayer againMe;
  DotaPlayer dotaMe;
  string local_b0;
  undefined1 local_90 [8];
  DotaPlayer jan;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Player me;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Merlin",&local_51);
  L13_1::Player::Player((Player *)local_30,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"Jan",(allocator *)&dotaMe.super_Player.field_0x27);
  L13_1::DotaPlayer::DotaPlayer((DotaPlayer *)local_90,0x66,&local_b0,true);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&dotaMe.super_Player.field_0x27);
  L13_1::Player::name((Player *)local_90);
  bVar1 = L13_1::Player::is_playing((Player *)local_90);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout," is playing right now...\n");
  }
  else {
    std::operator<<((ostream *)&std::cout," is not playing currently.\n");
  }
  L13_1::Player::name((Player *)local_90);
  poVar3 = std::operator<<((ostream *)&std::cout," played ");
  uVar2 = L13_1::DotaPlayer::get_game_played((DotaPlayer *)local_90);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
  std::operator<<(poVar3," games total.\n");
  L13_1::DotaPlayer::DotaPlayer
            ((DotaPlayer *)&againMe.super_Player._is_playing,0x400,(Player *)local_30);
  L13_1::Player::name((Player *)&againMe.super_Player._is_playing);
  poVar3 = std::operator<<((ostream *)&std::cout," played ");
  uVar2 = L13_1::DotaPlayer::get_game_played((DotaPlayer *)&againMe.super_Player._is_playing);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
  std::operator<<(poVar3," games total.\n");
  L13_1::DotaPlayer::DotaPlayer
            ((DotaPlayer *)&p1._is_playing,(DotaPlayer *)&againMe.super_Player._is_playing);
  L13_1::Player::name((Player *)&p1._is_playing);
  poVar3 = std::operator<<((ostream *)&std::cout," played ");
  uVar2 = L13_1::DotaPlayer::get_game_played((DotaPlayer *)&p1._is_playing);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
  std::operator<<(poVar3," games total.\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"Zeal",(allocator *)&p2.super_Player.field_0x27)
  ;
  L13_1::Player::Player((Player *)local_130,&local_150,true);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&p2.super_Player.field_0x27);
  L13_1::DotaPlayer::DotaPlayer((DotaPlayer *)&pp2,0xf2,(Player *)local_130);
  L13_1::Player::name((Player *)&pp2);
  L13_1::Player::Player((Player *)&p4._is_playing,(Player *)&pp2);
  L13_1::Player::Player((Player *)local_1d8,(Player *)&pp2);
  L13_1::Player::~Player((Player *)local_1d8);
  L13_1::Player::~Player((Player *)&p4._is_playing);
  L13_1::DotaPlayer::~DotaPlayer((DotaPlayer *)&pp2);
  L13_1::Player::~Player((Player *)local_130);
  L13_1::DotaPlayer::~DotaPlayer((DotaPlayer *)&p1._is_playing);
  L13_1::DotaPlayer::~DotaPlayer((DotaPlayer *)&againMe.super_Player._is_playing);
  L13_1::DotaPlayer::~DotaPlayer((DotaPlayer *)local_90);
  L13_1::Player::~Player((Player *)local_30);
  return;
}

Assistant:

void use_class_dota_player() {
    using std::cout;
    using std::endl;
    using namespace L13_1;

    Player me("Merlin");
    DotaPlayer jan(102, "Jan", true);
    jan.name();
    if (jan.is_playing()) {
        cout << " is playing right now...\n";
    } else {
        cout << " is not playing currently.\n";
    }
    jan.name();
    cout << " played " << jan.get_game_played() << " games total.\n";

    //  initialize use "me"
    DotaPlayer dotaMe(1024, me);
    dotaMe.name();
    cout << " played " << dotaMe.get_game_played() << " games total.\n";

    //  隐式调用 “复制构造函数”
    DotaPlayer againMe(dotaMe);
    againMe.name();
    cout << " played " << againMe.get_game_played() << " games total.\n";

    Player p1("Zeal", true);
//    DotaPlayer * pp1 = &p1; // not allowed
//    DotaPlayer & rp1 = p1;  // not allowed

    DotaPlayer p2(242, p1);
    Player * pp2 = &p2; //  its ok
    pp2->name();

    //  甚至可以用子类去实例化基类...
    //  隐式构造函数
    Player p3(p2);
    //  隐式重载赋值运算符
    Player p4 = p2;
}